

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

Var create_type_object(Context *ctx,Type type)

{
  Var obj;
  char *src;
  Var typeObj;
  Type type_local;
  Context *ctx_local;
  
  obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  src = wabt::GetTypeName(type);
  write_string(ctx,obj,0xb,src,0xffffffff);
  return obj;
}

Assistant:

Js::Var create_type_object(Context* ctx, Type type)
{
    Js::Var typeObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    write_string(ctx, typeObj, PropertyIds::type, GetTypeName(type));
    return typeObj;
}